

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O2

bool __thiscall xemmai::io::t_writer::f_write(t_writer *this,t_io *a_library)

{
  char *pcVar1;
  __pointer_type ptVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *paVar5;
  t_value<xemmai::t_pointer> n;
  long local_58;
  t_value<xemmai::t_pointer> local_50;
  atomic<xemmai::t_object_*> local_40 [2];
  __pointer_type local_30;
  
  ptVar2 = (this->v_buffer).v_p._M_b._M_p;
  pcVar1 = ptVar2->v_data + 8;
  pcVar3 = this->v_remain;
  if (this->v_remain == (char *)0x0) {
    this->v_remain = pcVar1;
    pcVar3 = pcVar1;
  }
  local_30 = (this->v_stream).v_p._M_b._M_p;
  local_40[0]._M_b._M_p = (__base_type)(this->v_buffer).v_p._M_b._M_p;
  local_58 = (long)pcVar3 - (long)pcVar1;
  t_value<xemmai::t_pointer>::f_invoke<xemmai::t_value<xemmai::t_pointer>,long,long>
            (&local_50,(t_object *)&stack0xffffffffffffffd0,
             (size_t *)(a_library->v_symbol_write).v_p._M_b._M_p,
             (t_value<xemmai::t_pointer> *)&f_write::index,(long *)local_40,&local_58);
  f_check<unsigned_long>(local_50.super_t_pointer.v_p,L"result of write");
  paVar5 = &local_50.field_0;
  if ((t_object *)0x4 < local_50.super_t_pointer.v_p) {
    paVar5 = (anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)
             (local_50.super_t_pointer.v_p)->v_data;
  }
  pcVar3 = this->v_p1;
  pcVar4 = this->v_remain + paVar5->v_integer;
  this->v_remain = pcVar4;
  if (pcVar3 <= pcVar4) {
    this->v_p1 = pcVar1;
    this->v_n1 = *(size_t *)ptVar2->v_data;
    this->v_remain = (char *)0x0;
  }
  return pcVar3 <= pcVar4;
}

Assistant:

bool t_writer::f_write(t_io* a_library)
{
	auto& buffer = v_buffer->f_as<t_bytes>();
	auto p = reinterpret_cast<char*>(&buffer[0]);
	if (!v_remain) v_remain = p;
	static size_t index;
	auto n = t_pvalue(v_stream).f_invoke(a_library->f_symbol_write(), index, t_pvalue(v_buffer), v_remain - p, v_p1 - v_remain);
	f_check<size_t>(n, L"result of write");
	v_remain += f_as<size_t>(n);
	if (v_remain < v_p1) return false;
	v_p1 = p;
	v_n1 = buffer.f_size();
	v_remain = nullptr;
	return true;
}